

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# math_test.cpp
# Opt level: O2

void __thiscall NextPrime_Basics_Test::NextPrime_Basics_Test(NextPrime_Basics_Test *this)

{
  testing::Test::Test(&this->super_Test);
  (this->super_Test)._vptr_Test = (_func_int **)&PTR__Test_0313d3b8;
  return;
}

Assistant:

TEST(NextPrime, Basics) {
    EXPECT_EQ(3, NextPrime(2));
    EXPECT_EQ(11, NextPrime(10));
    EXPECT_EQ(37, NextPrime(32));
    EXPECT_EQ(37, NextPrime(37));

    auto isPrime = [](int x) {
        if ((x & 1) == 0)
            return false;
        for (int i = 3; i < std::sqrt(x) + 1; i += 3) {
            if ((x % i) == 0)
                return false;
        }
        return true;
    };

    for (int n = 3; n < 8000; n += 3) {
        if (isPrime(n))
            EXPECT_EQ(n, NextPrime(n));
        else {
            int np = NextPrime(n);
            EXPECT_TRUE(isPrime(np));
        }
    }
}